

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void __thiscall Rml::ElementDocument::UpdateDocument(ElementDocument *this)

{
  Vector2f vp_dimensions;
  Vector2i VVar1;
  float dp_ratio;
  float fVar2;
  float fVar3;
  
  fVar3 = 1.0;
  fVar2 = 1.0;
  if (this->context == (Context *)0x0) {
    dp_ratio = 1.0;
  }
  else {
    dp_ratio = Context::GetDensityIndependentPixelRatio(this->context);
    if (this->context == (Context *)0x0) {
      fVar3 = 1.0;
      fVar2 = 1.0;
    }
    else {
      VVar1 = Context::GetDimensions(this->context);
      fVar3 = (float)VVar1.x;
      fVar2 = (float)VVar1.y;
    }
  }
  vp_dimensions.y = fVar2;
  vp_dimensions.x = fVar3;
  Element::Update(&this->super_Element,dp_ratio,vp_dimensions);
  UpdateLayout(this);
  UpdatePosition(this);
  return;
}

Assistant:

void ElementDocument::UpdateDocument()
{
	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));
	Update(dp_ratio, vp_dimensions);
	UpdateLayout();
	UpdatePosition();
}